

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     VoidFinalize<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state;
  ulong in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> **sdata_1;
  AggregateFinalizeData finalize_data;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> **sdata;
  ulong local_70;
  AggregateFinalizeData *in_stack_ffffffffffffffa8;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *in_stack_ffffffffffffffb0;
  AggregateFinalizeData local_48;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> **local_30;
  long local_28;
  ulong local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::GetData<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>*>
                         ((Vector *)0x8f0014);
    AggregateFinalizeData::AggregateFinalizeData(&local_48,local_18,local_10);
    VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>
    ::Finalize<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    state = (ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *)
            FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>*>
                      ((Vector *)0x8f0057);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffff98,local_18,local_10);
    for (local_70 = 0; local_70 < local_20; local_70 = local_70 + 1) {
      VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>
      ::Finalize<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
                (state,(AggregateFinalizeData *)(local_70 + local_28));
    }
  }
  return;
}

Assistant:

static void VoidFinalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                         idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<STATE_TYPE>(**sdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<STATE_TYPE>(*sdata[i], finalize_data);
			}
		}
	}